

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O1

REF_STATUS
ref_gather_node_scalar_txt
          (REF_NODE ref_node,REF_INT ldim,REF_DBL *scalar,char *separator,REF_BOOL prepend_xyz,
          FILE *file)

{
  size_t __size;
  REF_MPI ref_mpi;
  REF_DBL *pRVar1;
  FILE *__stream;
  int iVar2;
  uint uVar3;
  uint uVar4;
  REF_STATUS RVar5;
  void *output;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  undefined8 uVar9;
  void *__s;
  uint uVar10;
  uint uVar11;
  char *pcVar12;
  uint uVar13;
  REF_STATUS ref_private_macro_code_rxs;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  void *pvVar19;
  double dVar20;
  REF_INT local;
  uint local_12c;
  ulong local_f8;
  int local_e4;
  ulong local_e0;
  void *local_d8;
  long local_d0;
  FILE *local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  long local_a8;
  void *local_a0;
  ulong local_98;
  ulong local_90;
  REF_DBL *local_88;
  size_t local_80;
  void *local_78;
  void *local_70;
  ulong local_68;
  ulong local_60;
  char *local_58;
  long local_50;
  ulong local_48;
  long local_40;
  ulong local_38;
  
  uVar14 = (ulong)(uint)ldim;
  ref_mpi = ref_node->ref_mpi;
  uVar4 = (uint)(prepend_xyz != 0) * 3;
  uVar10 = (int)(ref_node->old_n_global / (long)ref_mpi->n) + 1;
  iVar16 = ref_mpi->reduce_byte_limit;
  iVar2 = 0x7fffffff;
  if (0 < iVar16) {
    iVar2 = iVar16 / (int)((uVar4 + ldim) * 8 + 8);
  }
  uVar13 = 0x7fffffff;
  if ((int)uVar10 < iVar2) {
    uVar13 = uVar10;
  }
  if ((0 < iVar16) && (iVar2 <= (int)uVar10)) {
    uVar13 = iVar16 / (int)((uVar4 + ldim) * 8 + 8);
  }
  uVar10 = uVar4 + ldim + 1;
  uVar7 = uVar13 * uVar10;
  local_88 = scalar;
  if ((int)uVar7 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x6d9,
           "ref_gather_node_scalar_txt","malloc local_xyzm of REF_DBL negative");
    RVar5 = 1;
  }
  else {
    local_e0 = (ulong)uVar7;
    __size = local_e0 * 8;
    local_58 = separator;
    local_d8 = malloc(__size);
    if (local_d8 == (void *)0x0) {
      pcVar12 = "malloc local_xyzm of REF_DBL NULL";
      uVar9 = 0x6d9;
    }
    else {
      output = malloc(__size);
      if (output != (void *)0x0) {
        lVar17 = ref_node->old_n_global;
        __s = local_d8;
        local_c8 = (FILE *)file;
        if (0 < lVar17) {
          uVar11 = uVar4 + ldim;
          local_c0 = (ulong)uVar11;
          local_a8 = (long)(int)uVar13;
          uVar3 = uVar11 - 1;
          local_e0 = local_e0 << 3;
          local_48 = (ulong)uVar10;
          local_90 = (ulong)(uVar4 + (uVar4 == 0));
          local_80 = local_48 * 8;
          local_d0 = (long)(int)uVar10;
          local_68 = 1;
          if (1 < (int)uVar3) {
            local_68 = (ulong)uVar3;
          }
          local_a0 = (void *)((long)local_d8 + (long)(int)uVar11 * 8);
          local_70 = (void *)((long)output + (long)(int)uVar11 * 8);
          local_78 = (void *)((long)output + (long)(int)uVar3 * 8);
          local_50 = local_d0 * 8;
          lVar6 = 0;
          local_b0 = (ulong)uVar4;
          local_98 = uVar14;
          local_60 = uVar14;
          do {
            uVar18 = lVar17 - lVar6 & 0xffffffff;
            if (local_a8 < lVar17 - lVar6) {
              uVar18 = (ulong)uVar13;
            }
            if (uVar7 != 0) {
              memset(__s,0,local_e0);
            }
            iVar16 = (int)uVar18;
            local_b8 = uVar18;
            if (0 < iVar16) {
              uVar15 = 0;
              uVar18 = local_b0;
              pvVar19 = __s;
              do {
                uVar4 = ref_node_local(ref_node,lVar6 + uVar15,&local_e4);
                if ((uVar4 != 0) && (uVar4 != 5)) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x6e9,"ref_gather_node_scalar_txt",(ulong)uVar4,"node local failed");
                  local_12c = uVar4;
                }
                if (uVar4 == 5) {
LAB_0013557c:
                  if (-1 < (int)local_c0) {
                    memset((void *)((long)__s + (ulong)(uVar10 * (int)uVar15) * 8),0,local_80);
                  }
                }
                else {
                  if (uVar4 != 0) {
                    return local_12c;
                  }
                  if (ref_mpi->id != ref_node->part[local_e4]) goto LAB_0013557c;
                  if (prepend_xyz != 0) {
                    pRVar1 = ref_node->real;
                    uVar8 = 0;
                    do {
                      *(REF_DBL *)((long)pvVar19 + uVar8 * 8) = pRVar1[(long)local_e4 * 0xf + uVar8]
                      ;
                      uVar8 = uVar8 + 1;
                    } while (local_90 != uVar8);
                  }
                  if (0 < (int)uVar14) {
                    uVar8 = 0;
                    do {
                      *(REF_DBL *)((long)__s + (long)((int)uVar8 + (int)uVar18) * 8) =
                           local_88[(long)(local_e4 * (int)uVar14) + uVar8];
                      uVar8 = uVar8 + 1;
                    } while (local_98 != uVar8);
                  }
                  *(undefined8 *)((long)local_a0 + uVar15 * local_d0 * 8) = 0x3ff0000000000000;
                }
                uVar15 = uVar15 + 1;
                pvVar19 = (void *)((long)pvVar19 + local_50);
                uVar18 = uVar18 + local_48;
              } while (uVar15 != local_b8);
            }
            uVar4 = ref_mpi_sum(ref_mpi,__s,output,iVar16 * uVar10,3);
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x6fb,"ref_gather_node_scalar_txt",(ulong)uVar4,"sum");
              return uVar4;
            }
            if ((ref_mpi->id == 0) && (0 < iVar16)) {
              local_f8 = 0;
              uVar18 = 0;
              do {
                local_40 = uVar18 * local_d0;
                dVar20 = *(double *)((long)local_70 + local_40 * 8) + -1.0;
                if (dVar20 <= -dVar20) {
                  dVar20 = -dVar20;
                }
                if (0.1 < dVar20) {
                  printf("error gather node %ld %f\n");
                }
                pcVar12 = local_58;
                uVar14 = local_68;
                __stream = local_c8;
                local_38 = uVar18;
                if (1 < (int)local_c0) {
                  uVar18 = 0;
                  do {
                    fprintf(__stream,"%.15e%s",
                            *(undefined8 *)((long)output + uVar18 * 8 + local_f8 * 8),pcVar12);
                    uVar18 = uVar18 + 1;
                  } while (uVar14 != uVar18);
                }
                uVar14 = local_60;
                if (0 < (int)local_60) {
                  fprintf(local_c8,"%.15e\n",*(undefined8 *)((long)local_78 + local_40 * 8));
                }
                uVar18 = local_38 + 1;
                local_f8 = (ulong)((int)local_f8 + uVar10);
                __s = local_d8;
              } while (uVar18 != local_b8);
            }
            lVar6 = lVar6 + iVar16;
            lVar17 = ref_node->old_n_global;
          } while (lVar6 < lVar17);
        }
        free(output);
        free(__s);
        return 0;
      }
      pcVar12 = "malloc xyzm of REF_DBL NULL";
      uVar9 = 0x6da;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar9,
           "ref_gather_node_scalar_txt",pcVar12);
    RVar5 = 2;
  }
  return RVar5;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_node_scalar_txt(
    REF_NODE ref_node, REF_INT ldim, REF_DBL *scalar, const char *separator,
    REF_BOOL prepend_xyz, FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT chunk;
  REF_DBL *local_xyzm, *xyzm;
  REF_GLOB global, nnode_written, first;
  REF_INT local, n, i, im, nxyz;
  REF_STATUS status;

  nxyz = 0;
  if (prepend_xyz) nxyz = 3;

  chunk = (REF_INT)(ref_node_n_global(ref_node) / ref_mpi_n(ref_mpi) + 1);
  chunk =
      MIN(chunk, ref_mpi_reduce_chunk_limit(
                     ref_mpi, (nxyz + ldim + 1) * (REF_INT)sizeof(REF_DBL)));

  ref_malloc(local_xyzm, (nxyz + ldim + 1) * chunk, REF_DBL);
  ref_malloc(xyzm, (nxyz + ldim + 1) * chunk, REF_DBL);

  nnode_written = 0;
  while (nnode_written < ref_node_n_global(ref_node)) {
    first = nnode_written;
    n = (REF_INT)MIN((REF_GLOB)chunk,
                     ref_node_n_global(ref_node) - nnode_written);

    nnode_written += n;

    for (i = 0; i < (nxyz + ldim + 1) * chunk; i++) local_xyzm[i] = 0.0;

    for (i = 0; i < n; i++) {
      global = first + i;
      status = ref_node_local(ref_node, global, &local);
      RXS(status, REF_NOT_FOUND, "node local failed");
      if (REF_SUCCESS == status &&
          ref_mpi_rank(ref_mpi) == ref_node_part(ref_node, local)) {
        for (im = 0; im < nxyz; im++)
          local_xyzm[im + (nxyz + ldim + 1) * i] =
              ref_node_xyz(ref_node, im, local);
        for (im = 0; im < ldim; im++)
          local_xyzm[nxyz + im + (nxyz + ldim + 1) * i] =
              scalar[im + ldim * local];
        local_xyzm[nxyz + ldim + (nxyz + ldim + 1) * i] = 1.0;
      } else {
        for (im = 0; im < (nxyz + ldim + 1); im++)
          local_xyzm[im + (nxyz + ldim + 1) * i] = 0.0;
      }
    }

    RSS(ref_mpi_sum(ref_mpi, local_xyzm, xyzm, (nxyz + ldim + 1) * n,
                    REF_DBL_TYPE),
        "sum");

    if (ref_mpi_once(ref_mpi))
      for (i = 0; i < n; i++) {
        if (ABS(xyzm[nxyz + ldim + (nxyz + ldim + 1) * i] - 1.0) > 0.1) {
          printf("error gather node " REF_GLOB_FMT " %f\n", first + i,
                 xyzm[nxyz + ldim + (nxyz + ldim + 1) * i]);
        }
        for (im = 0; im < nxyz + ldim - 1; im++) {
          fprintf(file, "%.15e%s", xyzm[im + (nxyz + ldim + 1) * i], separator);
        }
        if (ldim > 0)
          fprintf(file, "%.15e\n",
                  xyzm[(nxyz + ldim - 1) + (nxyz + ldim + 1) * i]);
      }
  }

  ref_free(xyzm);
  ref_free(local_xyzm);

  return REF_SUCCESS;
}